

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkInter(Abc_Ntk_t *pNtkOn,Abc_Ntk_t *pNtkOff,int fRelation,int fVerbose)

{
  uint *puVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  char *pcVar6;
  Vec_Ptr_t *pVVar7;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk2;
  long lVar8;
  
  iVar4 = pNtkOn->vCos->nSize;
  if (iVar4 == pNtkOff->vCos->nSize) {
    if (iVar4 == 1) {
      pAVar5 = Abc_NtkInterOne(pNtkOn,pNtkOff,fRelation,fVerbose);
      return pAVar5;
    }
    pAVar5 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar6 = Extra_UtilStrsav(pNtkOn->pName);
    pAVar5->pName = pcVar6;
    pVVar7 = pNtkOn->vPis;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        Abc_NtkDupObj(pAVar5,(Abc_Obj_t *)pVVar7->pArray[lVar8],1);
        lVar8 = lVar8 + 1;
        pVVar7 = pNtkOn->vPis;
      } while (lVar8 < pVVar7->nSize);
    }
    timeCnf = 0;
    timeSat = 0;
    timeInt = 0;
    pVVar7 = pNtkOn->vCos;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pVVar7->pArray[lVar8];
        pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
        pcVar6 = Abc_ObjName(pAVar2);
        pNtk = Abc_NtkCreateCone(pNtkOn,pAVar3,pcVar6,1);
        if ((pAVar2->field_0x15 & 4) != 0) {
          if (pNtk->vPos->nSize < 1) goto LAB_002ac2bc;
          puVar1 = (uint *)((long)*pNtk->vPos->pArray + 0x14);
          *puVar1 = *puVar1 ^ 0x400;
        }
        if (pNtkOff->vCos->nSize <= lVar8) {
LAB_002ac2bc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar2 = (Abc_Obj_t *)pNtkOff->vCos->pArray[lVar8];
        pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
        pcVar6 = Abc_ObjName(pAVar2);
        pNtk_00 = Abc_NtkCreateCone(pNtkOff,pAVar3,pcVar6,1);
        if ((pAVar2->field_0x15 & 4) != 0) {
          if (pNtk_00->vPos->nSize < 1) goto LAB_002ac2bc;
          puVar1 = (uint *)((long)*pNtk_00->vPos->pArray + 0x14);
          *puVar1 = *puVar1 ^ 0x400;
        }
        if (pNtk->nObjCounts[7] == 0) {
          pNtk2 = Abc_NtkDup(pNtk);
        }
        else if (pNtk_00->nObjCounts[7] == 0) {
          pNtk2 = Abc_NtkDup(pNtk_00);
          if (pNtk2->vPos->nSize < 1) goto LAB_002ac2bc;
          puVar1 = (uint *)((long)*pNtk2->vPos->pArray + 0x14);
          *puVar1 = *puVar1 ^ 0x400;
        }
        else {
          pNtk2 = Abc_NtkInterOne(pNtk,pNtk_00,0,fVerbose);
        }
        if (pNtk2 != (Abc_Ntk_t *)0x0) {
          Abc_NtkAppend(pAVar5,pNtk2,1);
          Abc_NtkDelete(pNtk2);
        }
        Abc_NtkDelete(pNtk);
        Abc_NtkDelete(pNtk_00);
        lVar8 = lVar8 + 1;
        pVVar7 = pNtkOn->vCos;
      } while (lVar8 < pVVar7->nSize);
    }
    pNtkOn = pAVar5;
    iVar4 = Abc_NtkCheck(pAVar5);
    if (iVar4 != 0) {
      return pAVar5;
    }
    pcVar6 = "Abc_NtkAttachBottom(): Network check has failed.\n";
  }
  else {
    pcVar6 = "Currently works only for networks with equal number of POs.\n";
    pAVar5 = (Abc_Ntk_t *)0x0;
  }
  Abc_Print((int)pNtkOn,pcVar6);
  return pAVar5;
}

Assistant:

Abc_Ntk_t * Abc_NtkInter( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose )
{
    Abc_Ntk_t * pNtkOn1, * pNtkOff1, * pNtkInter1, * pNtkInter;
    Abc_Obj_t * pObj;
    int i; //, clk = Abc_Clock();
    if ( Abc_NtkCoNum(pNtkOn) != Abc_NtkCoNum(pNtkOff) )
    {
        Abc_Print( 1, "Currently works only for networks with equal number of POs.\n" );
        return NULL;
    }
    // compute the fast interpolation time
//    Abc_NtkInterFast( pNtkOn, pNtkOff, fVerbose );
    // consider the case of one output
    if ( Abc_NtkCoNum(pNtkOn) == 1 )
        return Abc_NtkInterOne( pNtkOn, pNtkOff, fRelation, fVerbose );
    // start the new network
    pNtkInter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkInter->pName = Extra_UtilStrsav(pNtkOn->pName);
    Abc_NtkForEachPi( pNtkOn, pObj, i )
        Abc_NtkDupObj( pNtkInter, pObj, 1 );
    // process each POs separately
timeCnf = 0;
timeSat = 0;
timeInt = 0;
    Abc_NtkForEachCo( pNtkOn, pObj, i )
    {
        pNtkOn1 = Abc_NtkCreateCone( pNtkOn, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 1 );
        if ( Abc_ObjFaninC0(pObj) )
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkOn1, 0), 0 );

        pObj   = Abc_NtkCo(pNtkOff, i);
        pNtkOff1 = Abc_NtkCreateCone( pNtkOff, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 1 );
        if ( Abc_ObjFaninC0(pObj) )
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkOff1, 0), 0 );

        if ( Abc_NtkNodeNum(pNtkOn1) == 0 )
            pNtkInter1 = Abc_NtkDup( pNtkOn1 );
        else if ( Abc_NtkNodeNum(pNtkOff1) == 0 )
        {
            pNtkInter1 = Abc_NtkDup( pNtkOff1 );
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkInter1, 0), 0 );
        }
        else
            pNtkInter1 = Abc_NtkInterOne( pNtkOn1, pNtkOff1, 0, fVerbose );
        if ( pNtkInter1 )
        {
            Abc_NtkAppend( pNtkInter, pNtkInter1, 1 );
            Abc_NtkDelete( pNtkInter1 );
        }

        Abc_NtkDelete( pNtkOn1 );
        Abc_NtkDelete( pNtkOff1 );
    }
//    ABC_PRT( "CNF", timeCnf );
//    ABC_PRT( "SAT", timeSat );
//    ABC_PRT( "Int", timeInt );
//    ABC_PRT( "Slow interpolation time", Abc_Clock() - clk );

    // return the network
    if ( !Abc_NtkCheck( pNtkInter ) )
        Abc_Print( 1, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkInter;
}